

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

void Tim_ManPrint(Tim_Man_t *p)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Tim_Box_t *pBox;
  Tim_Obj_t *pTVar7;
  Tim_Obj_t *pTVar8;
  float *pfVar9;
  int iVar10;
  uint uVar11;
  float *pfVar12;
  Vec_Ptr_t *p_00;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  if (p == (Tim_Man_t *)0x0) {
    return;
  }
  puts("TIMING MANAGER:");
  uVar2 = Tim_ManPiNum(p);
  uVar11 = p->nCis;
  uVar3 = Tim_ManPoNum(p);
  uVar14 = 0;
  uVar13 = 0;
  if (p->vBoxes != (Vec_Ptr_t *)0x0) {
    uVar13 = (ulong)(uint)p->vBoxes->nSize;
  }
  printf("PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n",(ulong)uVar2,(ulong)uVar11,(ulong)uVar3,
         (ulong)(uint)p->nCos,uVar13);
  pTVar7 = p->pCis;
  pfVar9 = &pTVar7->timeReq;
  uVar11 = p->nCis;
  uVar13 = 0;
  pfVar12 = pfVar9;
  if (0 < (int)uVar11) {
    uVar13 = (ulong)uVar11;
  }
  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    if ((pTVar7 == (Tim_Obj_t *)0x0) ||
       (((int)pfVar12[-3] < 0 &&
        ((((pTVar7->timeArr != pfVar12[-1] || (NAN(pTVar7->timeArr) || NAN(pfVar12[-1]))) ||
          (*pfVar9 != *pfVar12)) || (NAN(*pfVar9) || NAN(*pfVar12))))))) {
      uVar13 = uVar14 & 0xffffffff;
      break;
    }
    pfVar12 = pfVar12 + 6;
  }
  if ((uint)uVar13 == uVar11) {
    printf("All PIs     :  arrival = %5.3f  required = %5.3f\n",(double)pTVar7->timeArr,
           (double)pTVar7->timeReq);
  }
  else {
    lVar17 = 0x14;
    lVar16 = 0;
    while ((lVar16 < (int)uVar11 && (pTVar7 = p->pCis, pTVar7 != (Tim_Obj_t *)0x0))) {
      if (*(int *)((long)pTVar7 + lVar17 + -0xc) < 0) {
        printf("PI%5d     :  arrival = %5.3f  required = %5.3f\n",
               (double)*(float *)((long)pTVar7 + lVar17 + -4),
               (double)*(float *)((long)&pTVar7->Id + lVar17));
        uVar11 = p->nCis;
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x18;
    }
  }
  pTVar7 = p->pCos;
  pfVar9 = &pTVar7->timeReq;
  uVar11 = p->nCos;
  uVar14 = 0;
  uVar13 = 0;
  pfVar12 = pfVar9;
  if (0 < (int)uVar11) {
    uVar13 = (ulong)uVar11;
  }
  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    if ((pTVar7 == (Tim_Obj_t *)0x0) ||
       (((int)pfVar12[-3] < 0 &&
        (((pTVar7->timeArr != pfVar12[-1] || (NAN(pTVar7->timeArr) || NAN(pfVar12[-1]))) ||
         ((*pfVar9 != *pfVar12 || (NAN(*pfVar9) || NAN(*pfVar12))))))))) {
      uVar13 = uVar14 & 0xffffffff;
      break;
    }
    pfVar12 = pfVar12 + 6;
  }
  if ((uint)uVar13 == uVar11) {
    printf("All POs     :  arrival = %5.3f  required = %5.3f\n",(double)pTVar7->timeArr,
           (double)pTVar7->timeReq);
  }
  else {
    lVar16 = 0;
    lVar17 = 0x14;
    while ((lVar16 < (int)uVar11 && (pTVar7 = p->pCos, pTVar7 != (Tim_Obj_t *)0x0))) {
      if (*(int *)((long)pTVar7 + lVar17 + -0xc) < 0) {
        printf("PO%5d     :  arrival = %5.3f  required = %5.3f\n",
               (double)*(float *)((long)pTVar7 + lVar17 + -4),
               (double)*(float *)((long)&pTVar7->Id + lVar17));
        uVar11 = p->nCos;
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x18;
    }
  }
  if ((p->vBoxes != (Vec_Ptr_t *)0x0) && (0 < p->vBoxes->nSize)) {
    uVar11 = 0;
    do {
      if (p->vBoxes->nSize <= (int)uVar11) break;
      pBox = (Tim_Box_t *)Vec_PtrEntry(p->vBoxes,uVar11);
      uVar2 = pBox->nInputs;
      uVar3 = pBox->nOutputs;
      uVar4 = Tim_ManBoxInputFirst(p,uVar11);
      uVar5 = Tim_ManBoxOutputFirst(p,uVar11);
      iVar10 = 0;
      printf("*** Box %5d :  I =%4d. O =%4d. I1 =%6d. O1 =%6d. Table =%4d\n",(ulong)uVar11,
             (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,pBox->iDelayTable);
      pTVar7 = Tim_ManBoxInput(p,pBox,0);
      while ((((iVar10 < pBox->nInputs &&
               (pTVar8 = Tim_ManBoxInput(p,pBox,iVar10), pTVar8 != (Tim_Obj_t *)0x0)) &&
              (pTVar7->timeArr == pTVar8->timeArr)) &&
             (((!NAN(pTVar7->timeArr) && !NAN(pTVar8->timeArr) &&
               (pTVar7->timeReq == pTVar8->timeReq)) &&
              (!NAN(pTVar7->timeReq) && !NAN(pTVar8->timeReq)))))) {
        iVar10 = iVar10 + 1;
      }
      iVar6 = Tim_ManBoxInputNum(p,pBox->iBox);
      if (iVar6 == iVar10) {
        printf("Box inputs  :  arrival = %5.3f  required = %5.3f\n",(double)pTVar7->timeArr,
               (double)pTVar7->timeReq);
      }
      else {
        uVar2 = 0;
        while (((int)uVar2 < pBox->nInputs &&
               (pTVar7 = Tim_ManBoxInput(p,pBox,uVar2), pTVar7 != (Tim_Obj_t *)0x0))) {
          printf("box-in%4d :  arrival = %5.3f  required = %5.3f\n",(double)pTVar7->timeArr,
                 (double)pTVar7->timeReq,(ulong)uVar2);
          uVar2 = uVar2 + 1;
        }
      }
      iVar10 = 0;
      pTVar7 = Tim_ManBoxOutput(p,pBox,0);
      while ((((iVar10 < pBox->nOutputs &&
               (pTVar8 = Tim_ManBoxOutput(p,pBox,iVar10), pTVar8 != (Tim_Obj_t *)0x0)) &&
              (pTVar7->timeArr == pTVar8->timeArr)) &&
             (((!NAN(pTVar7->timeArr) && !NAN(pTVar8->timeArr) &&
               (pTVar7->timeReq == pTVar8->timeReq)) &&
              (!NAN(pTVar7->timeReq) && !NAN(pTVar8->timeReq)))))) {
        iVar10 = iVar10 + 1;
      }
      iVar6 = Tim_ManBoxOutputNum(p,pBox->iBox);
      if (iVar6 == iVar10) {
        printf("Box outputs :  arrival = %5.3f  required = %5.3f\n",(double)pTVar7->timeArr,
               (double)pTVar7->timeReq);
      }
      else {
        iVar10 = 0;
        while ((iVar10 < pBox->nOutputs &&
               (pTVar7 = Tim_ManBoxOutput(p,pBox,iVar10), pTVar7 != (Tim_Obj_t *)0x0))) {
          printf("box-out%3d :  arrival = %5.3f  required = %5.3f\n",(double)pTVar7->timeArr,
                 (double)pTVar7->timeReq);
          iVar10 = iVar10 + 1;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
  }
  p_00 = p->vDelayTables;
  if ((p_00 != (Vec_Ptr_t *)0x0) && (iVar10 = p_00->nSize, 0 < iVar10)) {
    for (uVar11 = 0; (int)uVar11 < iVar10; uVar11 = uVar11 + 1) {
      pfVar9 = (float *)Vec_PtrEntry(p_00,uVar11);
      if (pfVar9 != (float *)0x0) {
        printf("Delay table %d:\n",(ulong)uVar11);
        if (uVar11 != (int)*pfVar9) {
          __assert_fail("i == (int)pTable[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x25d,"void Tim_ManPrint(Tim_Man_t *)");
        }
        uVar2 = (uint)pfVar9[1];
        uVar13 = 0;
        if (0 < (int)uVar2) {
          uVar13 = (ulong)uVar2;
        }
        uVar3 = (int)pfVar9[2];
        if ((int)pfVar9[2] < 1) {
          uVar3 = 0;
        }
        pfVar9 = pfVar9 + 3;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
            fVar1 = pfVar9[uVar15];
            if ((fVar1 != -1e+09) || (NAN(fVar1))) {
              printf("%5.0f",(double)fVar1);
            }
            else {
              printf("%5s","-");
            }
          }
          putchar(10);
          pfVar9 = pfVar9 + (int)uVar2;
        }
      }
      p_00 = p->vDelayTables;
      iVar10 = p_00->nSize;
    }
  }
  putchar(10);
  return;
}

Assistant:

void Tim_ManPrint( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj, * pPrev;
    float * pTable;
    int i, j, k, TableX, TableY;
    if ( p == NULL )
        return;
    printf( "TIMING MANAGER:\n" );
    printf( "PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), Tim_ManPoNum(p), Tim_ManCoNum(p), Tim_ManBoxNum(p) );

    // print CI info
    pPrev = p->pCis;
    Tim_ManForEachPi( p, pObj, i )
        if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
            break;
    if ( i == Tim_ManCiNum(p) )
        printf( "All PIs     :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
    else
        Tim_ManForEachPi( p, pObj, i )
            printf( "PI%5d     :  arrival = %5.3f  required = %5.3f\n", i, pObj->timeArr, pObj->timeReq );

    // print CO info
    pPrev = p->pCos;
    Tim_ManForEachPo( p, pObj, i )
        if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
            break;
    if ( i == Tim_ManCoNum(p) )
        printf( "All POs     :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
    else
    {
        int k = 0;
        Tim_ManForEachPo( p, pObj, i )
            printf( "PO%5d     :  arrival = %5.3f  required = %5.3f\n", k++, pObj->timeArr, pObj->timeReq );
    }

    // print box info
    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
    {
        printf( "*** Box %5d :  I =%4d. O =%4d. I1 =%6d. O1 =%6d. Table =%4d\n", 
            i, pBox->nInputs, pBox->nOutputs, 
            Tim_ManBoxInputFirst(p, i), Tim_ManBoxOutputFirst(p, i), 
            pBox->iDelayTable );

        // print box inputs
        pPrev = Tim_ManBoxInput( p, pBox, 0 );
        Tim_ManBoxForEachInput( p, pBox, pObj, k )
            if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
                break;
        if ( k == Tim_ManBoxInputNum(p, pBox->iBox) )
            printf( "Box inputs  :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
        else
            Tim_ManBoxForEachInput( p, pBox, pObj, k )
                printf( "box-in%4d :  arrival = %5.3f  required = %5.3f\n", k, pObj->timeArr, pObj->timeReq );

        // print box outputs
        pPrev = Tim_ManBoxOutput( p, pBox, 0 );
        Tim_ManBoxForEachOutput( p, pBox, pObj, k )
            if ( pPrev->timeArr != pObj->timeArr || pPrev->timeReq != pObj->timeReq )
                break;
        if ( k == Tim_ManBoxOutputNum(p, pBox->iBox) )
            printf( "Box outputs :  arrival = %5.3f  required = %5.3f\n", pPrev->timeArr, pPrev->timeReq );
        else
            Tim_ManBoxForEachOutput( p, pBox, pObj, k )
                printf( "box-out%3d :  arrival = %5.3f  required = %5.3f\n", k, pObj->timeArr, pObj->timeReq );

        if ( i > 2 )
            break;
    }

    // print delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    Tim_ManForEachTable( p, pTable, i )
    {
        if ( pTable == NULL )
            continue;
        printf( "Delay table %d:\n", i );
        assert( i == (int)pTable[0] );
        TableX = (int)pTable[1];
        TableY = (int)pTable[2];
        for ( j = 0; j < TableY; j++, printf( "\n" ) )
            for ( k = 0; k < TableX; k++ )
                if ( pTable[3+j*TableX+k] == -ABC_INFINITY )
                    printf( "%5s", "-" );
                else
                    printf( "%5.0f", pTable[3+j*TableX+k] );
    }
    printf( "\n" );
}